

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O0

shared_ptr<cppnet::EventActions> cppnet::MakeEventActions(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppnet::EventActions> *in_RDI;
  shared_ptr<cppnet::EventActions> sVar1;
  shared_ptr<cppnet::EpollEventActions> local_20;
  
  std::make_shared<cppnet::EpollEventActions>();
  std::shared_ptr<cppnet::EventActions>::shared_ptr<cppnet::EpollEventActions,void>
            (in_RDI,&local_20);
  std::shared_ptr<cppnet::EpollEventActions>::~shared_ptr(&local_20);
  sVar1.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<cppnet::EventActions>)
         sVar1.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<EventActions> MakeEventActions() {
    return std::make_shared<EpollEventActions>();
}